

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall
sptk::reaper::EpochTracker::GetPulseCorrelations
          (EpochTracker *this,float window_dur,float peak_thresh)

{
  float fVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  vector<float,_std::allocator<float>_> *pvVar7;
  reference pvVar8;
  vector<float,_std::allocator<float>_> *pvVar9;
  reference pvVar10;
  long in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  size_t i_1;
  size_t end;
  int32_t start;
  size_t peak;
  int32_t old_start;
  int32_t min_step;
  size_t i;
  float kPcmFract;
  float kResidFract;
  float kMinCorrelationStep;
  vector<float,_std::allocator<float>_> mixture;
  int32_t frame_size;
  int32_t half_wind;
  int32_t window_size;
  int32_t max_lag;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff00;
  size_type in_stack_ffffffffffffff08;
  vector<float,_std::allocator<float>_> *pvVar11;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int32_t iVar15;
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  *in_stack_ffffffffffffff28;
  vector<short,_std::allocator<short>_> *in_stack_ffffffffffffff30;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff38;
  EpochTracker *in_stack_ffffffffffffff40;
  ulong local_80;
  undefined4 in_stack_ffffffffffffff90;
  vector<float,_std::allocator<float>_> *local_68;
  int local_60;
  ulong local_58;
  vector<float,_std::allocator<float>_> local_38;
  int local_20;
  int local_1c;
  int32_t local_18;
  int local_14;
  float local_10;
  float local_c;
  
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  iVar2 = RoundUp(*(float *)(in_RDI + 0x128) / *(float *)(in_RDI + 0x16c));
  *(int32_t *)(in_RDI + 0x138) = iVar2;
  local_14 = RoundUp(*(float *)(in_RDI + 0x128) / *(float *)(in_RDI + 0x168));
  *(int *)(in_RDI + 0x13c) = local_14 - *(int *)(in_RDI + 0x138);
  local_18 = RoundUp(local_c * *(float *)(in_RDI + 0x128));
  local_1c = local_18 / 2;
  local_20 = local_18 + local_14;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x12076d);
  std::vector<float,_std::allocator<float>_>::size
            ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x50));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
            );
  for (local_58 = 0;
      sVar5 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x50)), local_58 < sVar5
      ; local_58 = local_58 + 1) {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x50),local_58);
    fVar12 = *pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x38),local_58);
    fVar1 = *pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,local_58);
    *pvVar6 = fVar12 * 0.7 + fVar1 * 0.3;
  }
  iVar2 = RoundUp(*(float *)(in_RDI + 0x128) * 0.001);
  local_60 = (int)-((double)iVar2 * 2.0);
  local_68 = (vector<float,_std::allocator<float>_> *)0x0;
  while (pvVar11 = local_68,
        pvVar7 = (vector<float,_std::allocator<float>_> *)
                 std::
                 vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ::size((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                         *)(in_RDI + 8)), pvVar11 < pvVar7) {
    pvVar8 = std::
             vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
             ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                           *)(in_RDI + 8),(size_type)local_68);
    iVar3 = pvVar8->resid_index - local_1c;
    if (iVar3 < 0) {
      iVar3 = 0;
    }
    iVar4 = iVar3 + local_20;
    pvVar7 = (vector<float,_std::allocator<float>_> *)(long)iVar4;
    pvVar9 = (vector<float,_std::allocator<float>_> *)
             std::vector<float,_std::allocator<float>_>::size(&local_38);
    if (((vector<float,_std::allocator<float>_> *)(long)iVar4 < pvVar9) &&
       (iVar2 <= iVar3 - local_60)) {
      uVar13 = *(undefined4 *)(in_RDI + 0x138);
      uVar14 = *(undefined4 *)(in_RDI + 0x13c);
      iVar15 = local_18;
      local_60 = iVar3;
      std::
      vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
      ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    *)(in_RDI + 8),(size_type)local_68);
      CrossCorrelation(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                       (int32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                       (int32_t)in_stack_ffffffffffffff30,
                       (int32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                       (int32_t)in_stack_ffffffffffffff28,pvVar11);
      in_stack_ffffffffffffff00 = (vector<float,_std::allocator<float>_> *)(in_RDI + 8);
      pvVar8 = std::
               vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
               ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                             *)in_stack_ffffffffffffff00,(size_type)local_68);
      pvVar11 = &pvVar8->nccf;
      fVar12 = local_10;
      std::
      vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
      ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    *)in_stack_ffffffffffffff00,(size_type)local_68);
      FindNccfPeaks((EpochTracker *)CONCAT44(iVar15,uVar14),
                    (vector<float,_std::allocator<float>_> *)CONCAT44(uVar13,iVar3),fVar12,
                    (vector<short,_std::allocator<short>_> *)pvVar11);
      local_80 = 0;
      while( true ) {
        pvVar8 = std::
                 vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                               *)(in_RDI + 8),(size_type)local_68);
        sVar5 = std::vector<short,_std::allocator<short>_>::size(&pvVar8->nccf_periods);
        if (sVar5 <= local_80) break;
        uVar13 = *(undefined4 *)(in_RDI + 0x138);
        pvVar8 = std::
                 vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                               *)(in_RDI + 8),(size_type)local_68);
        pvVar10 = std::vector<short,_std::allocator<short>_>::operator[]
                            (&pvVar8->nccf_periods,local_80);
        *pvVar10 = *pvVar10 + (short)uVar13;
        local_80 = local_80 + 1;
      }
    }
    else {
      in_stack_ffffffffffffff38 = (vector<float,_std::allocator<float>_> *)(in_RDI + 8);
      pvVar8 = std::
               vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
               ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                             *)in_stack_ffffffffffffff38,
                            (size_type)
                            ((long)&local_68[-1].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      in_stack_ffffffffffffff40 = (EpochTracker *)&pvVar8->nccf;
      std::
      vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
      ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    *)in_stack_ffffffffffffff38,(size_type)local_68);
      std::vector<float,_std::allocator<float>_>::operator=
                ((vector<float,_std::allocator<float>_> *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                 pvVar7);
      in_stack_ffffffffffffff28 =
           (vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
            *)(in_RDI + 8);
      pvVar8 = std::
               vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
               ::operator[](in_stack_ffffffffffffff28,
                            (size_type)
                            ((long)&local_68[-1].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      in_stack_ffffffffffffff30 = &pvVar8->nccf_periods;
      std::
      vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
      ::operator[](in_stack_ffffffffffffff28,(size_type)local_68);
      std::vector<short,_std::allocator<short>_>::operator=
                ((vector<short,_std::allocator<short>_> *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                 (vector<short,_std::allocator<short>_> *)pvVar7);
    }
    local_68 = (vector<float,_std::allocator<float>_> *)
               ((long)&(local_68->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void EpochTracker::GetPulseCorrelations(float window_dur, float peak_thresh) {
  first_nccf_lag_ = RoundUp(sample_rate_ / max_f0_search_);
  int32_t max_lag = RoundUp(sample_rate_ / min_f0_search_);
  n_nccf_lags_ = max_lag - first_nccf_lag_;
  int32_t window_size = RoundUp(window_dur * sample_rate_);
  int32_t half_wind = window_size / 2;
  int32_t frame_size = window_size + max_lag;

  std::vector<float> mixture;
  mixture.resize(residual_.size());
  const float kMinCorrelationStep = 0.001;  // Pulse separation
  // before computing new
  // correlation values.
  const float kResidFract = 0.7;  // Fraction of the residual to use.
  const float kPcmFract = 1.0 - kResidFract;  // Fraction of the input to use.
  for (size_t i = 0; i < residual_.size(); ++i) {
    mixture[i] = (kResidFract * residual_[i]) + (kPcmFract * signal_[i]);
  }

  int32_t min_step = RoundUp(sample_rate_ * kMinCorrelationStep);
  int32_t old_start = - (2.0 * min_step);
  for (size_t peak = 0; peak < resid_peaks_.size(); ++peak) {
    int32_t start = resid_peaks_[peak].resid_index - half_wind;
    if (start < 0) {
      start = 0;
    }
    size_t end = start + frame_size;
    if ((end >= mixture.size()) || ((start - old_start) < min_step)) {
      resid_peaks_[peak].nccf = resid_peaks_[peak - 1].nccf;
      resid_peaks_[peak].nccf_periods = resid_peaks_[peak - 1].nccf_periods;
    } else {
      CrossCorrelation(mixture, start, first_nccf_lag_, n_nccf_lags_,
                       window_size, &(resid_peaks_[peak].nccf));
      FindNccfPeaks(resid_peaks_[peak].nccf, peak_thresh,
                    &(resid_peaks_[peak].nccf_periods));
      // Turn the peak indices from FindNccfPeaks into NCCF period hyps.
      for (size_t i = 0; i < resid_peaks_[peak].nccf_periods.size(); ++i) {
        resid_peaks_[peak].nccf_periods[i] += first_nccf_lag_;
      }
      old_start = start;
    }
  }
}